

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# registration.c
# Opt level: O3

void registration_service_update
               (registration_service_handle *rs,size_t slots_used,size_t slots_total)

{
  void *pvVar1;
  
  pvVar1 = rs->priv;
  mutex_lock((mutex_handle *)((long)pvVar1 + 0x20));
  if (*(uint *)((long)pvVar1 + 0x58) < 3) {
    *(uint *)((long)pvVar1 + 0x58) = 2 - (uint)(slots_used < slots_total);
    *(size_t *)((long)pvVar1 + 0x50) = slots_used;
    *(size_t *)((long)pvVar1 + 0x48) = slots_total;
    worker_wake((worker_handle *)((long)pvVar1 + 0x28));
  }
  mutex_unlock((mutex_handle *)((long)pvVar1 + 0x20));
  return;
}

Assistant:

void registration_service_update(struct registration_service_handle *rs,
				 size_t slots_used, size_t slots_total)
{
	struct registration_service_priv *priv = rs->priv;

	mutex_lock(&priv->mutex);
	if (priv->status < REGISTRATION_STATUS_OFF) {
		priv->status = slots_used >= slots_total ?
			       REGISTRATION_STATUS_BUSY :
			       REGISTRATION_STATUS_READY;
		priv->slots_used = slots_used;
		priv->slots_total = slots_total;
		worker_wake(&priv->worker);
	}
	mutex_unlock(&priv->mutex);
}